

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryRead
          (BlockedWrite *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  _func_int *p_Var1;
  void *pvVar2;
  AsyncCapabilityStream *extraout_RDX;
  undefined8 minBytes_00;
  size_t in_R8;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:497:21)>
  *location;
  void *continuationTracePtr;
  AsyncInputStream local_68;
  AsyncOutputStream local_60;
  Disposer local_58;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  tryReadImpl(&local_50,(BlockedWrite *)buffer,(void *)minBytes,maxBytes,in_R8);
  minBytes_00 = local_50.field_1._0_8_;
  local_60._vptr_AsyncOutputStream = (_func_int **)local_50.field_1._24_8_;
  if ((local_50.tag != 2) &&
     (local_50.field_1._8_8_ = maxBytes, minBytes_00 = extraout_RDX,
     local_60._vptr_AsyncOutputStream = (_func_int **)&local_50, local_50.tag == 1)) {
    minBytes_00 = local_50.field_1._0_8_;
  }
  if (local_50.tag == 2) {
    AsyncPipe::tryRead((AsyncPipe *)&local_68,*(void **)((long)buffer + 0x18),minBytes_00,
                       local_50.field_1._8_8_);
    local_50._0_8_ =
         kj::_::
         SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:497:21)>
         ::anon_class_8_1_54a3980e_for_func::operator();
    p_Var1 = local_68._vptr_AsyncInputStream[1];
    if (p_Var1 == (_func_int *)0x0 ||
        (ulong)((long)local_68._vptr_AsyncInputStream - (long)p_Var1) < 0x28) {
      pvVar2 = operator_new(0x400);
      location = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:497:21)>
                  *)((long)pvVar2 + 0x3d8);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68,
                 (anon_class_8_1_54a3980e_for_func *)&local_60,(void **)&local_50);
      *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
    }
    else {
      local_68._vptr_AsyncInputStream[1] = (_func_int *)0x0;
      location = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:497:21)>
                  *)(local_68._vptr_AsyncInputStream + -5);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68,
                 (anon_class_8_1_54a3980e_for_func *)&local_60,(void **)&local_50);
      local_68._vptr_AsyncInputStream[-4] = p_Var1;
    }
    local_58._vptr_Disposer = (_func_int **)0x0;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)location;
    local_28.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_58);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68);
  }
  else {
    if (local_50.tag != 1) {
      kj::_::unreachable();
    }
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,minBytes_00);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
      KJ_SWITCH_ONEOF(tryReadImpl(buffer, minBytes, maxBytes)) {
        KJ_CASE_ONEOF(done, Done) {
          return done.result;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          return pipe.tryRead(retry.buffer, retry.minBytes, retry.maxBytes)
              .then([n = retry.alreadyRead](size_t amount) { return amount + n; });
        }
      }
      KJ_UNREACHABLE;
    }